

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseData.cpp
# Opt level: O3

void __thiscall
SGParser::Generator::StdGrammarStackElement::ShiftToken
          (StdGrammarStackElement *this,TokenType *token,
          TokenStream<SGParser::Generator::StdGrammarToken> *stream)

{
  CodeType CVar1;
  pointer pcVar2;
  String *pSVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  
  this->Line = token->Line;
  this->Offset = token->Offset;
  if ((this->field_1).pData != (void *)0x0) {
    __assert_fail("pData == nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Parser-Builder-Org[P]SGParser/src/ParserGen/ParseData.cpp"
                  ,0x1d2,
                  "void SGParser::Generator::StdGrammarStackElement::ShiftToken(TokenType &, TokenStream<TokenType> &)"
                 );
  }
  CVar1 = (token->super_TokenCode).Code;
  if (CVar1 != 3) {
    if (CVar1 == 0x22) {
      pSVar3 = (String *)operator_new(0x20);
      (pSVar3->_M_dataplus)._M_p = (pointer)&pSVar3->field_2;
      pSVar3->_M_string_length = 0;
      (pSVar3->field_2)._M_local_buf[0] = '\0';
      (this->field_1).pString = pSVar3;
      this->Type = 0x20000000;
      if ((token->Str)._M_string_length < 3) {
        return;
      }
      uVar6 = 1;
      uVar4 = 2;
      do {
        pcVar2 = (token->Str)._M_dataplus._M_p;
        uVar7 = uVar6;
        if ((pcVar2[uVar6] == '\'') && (uVar7 = uVar4, pcVar2[uVar4] != '\'')) {
          uVar7 = uVar6;
        }
        std::__cxx11::string::push_back(SUB81(this->field_1,0));
        uVar6 = uVar7 + 1;
        uVar4 = uVar7 + 2;
      } while (uVar4 < (token->Str)._M_string_length);
      return;
    }
    if (CVar1 != 5) {
      pSVar3 = (String *)0x0;
      uVar5 = 0;
      goto LAB_00137639;
    }
  }
  pSVar3 = (String *)operator_new(0x20);
  (pSVar3->_M_dataplus)._M_p = (pointer)&pSVar3->field_2;
  pcVar2 = (token->Str)._M_dataplus._M_p;
  uVar5 = 0x20000000;
  std::__cxx11::string::_M_construct<char*>
            ((string *)pSVar3,pcVar2,pcVar2 + (token->Str)._M_string_length);
LAB_00137639:
  (this->field_1).pString = pSVar3;
  this->Type = uVar5;
  return;
}

Assistant:

void ShiftToken(TokenType& token, [[maybe_unused]] TokenStream<TokenType>& stream) {
        // Always get the line and offset
        Line   = token.Line;
        Offset = token.Offset;
        SG_ASSERT(pData == nullptr);

        switch (token.Code) {
            case SGL_number_int:
            case SGL_identifier:
                pString = new String{token.Str};
                Type    = DataString;
                break;

            case SGL_quote_cons: {
                pString = new String;
                Type    = DataString;

                // Turn double '' to single ones
                // Copy the String but not the first and last quote characters
                for (size_t i = 1u; i + 1u < token.Str.size(); ++i) {
                    if (token.Str[i] == '\'' && token.Str[i + 1u] == '\'')
                        ++i;
                    *pString += token.Str[i];
                }
                break;
            }

            default:
                pData = nullptr;
                Type  = DataEmpty;
                break;
        }
    }